

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O0

bool ON_IsRightHandFrame(ON_3dVector *X,ON_3dVector *Y,ON_3dVector *Z)

{
  bool bVar1;
  double dVar2;
  ON_3dVector local_48;
  double x;
  ON_3dVector *Z_local;
  ON_3dVector *Y_local;
  ON_3dVector *X_local;
  
  x = (double)Z;
  Z_local = Y;
  Y_local = X;
  bVar1 = ON_IsOrthonormalFrame(X,Y,Z);
  if (bVar1) {
    ON_CrossProduct(&local_48,Y_local,Z_local);
    dVar2 = ON_DotProduct(&local_48,(ON_3dVector *)x);
    if (1.490116119385e-08 < dVar2) {
      X_local._7_1_ = true;
    }
    else {
      X_local._7_1_ = false;
    }
  }
  else {
    X_local._7_1_ = false;
  }
  return X_local._7_1_;
}

Assistant:

bool ON_IsRightHandFrame( const ON_3dVector& X,  const ON_3dVector& Y,  const ON_3dVector& Z )
{
  // returns true if X, Y, Z is an orthonormal right hand frame
  if ( !ON_IsOrthonormalFrame(X,Y,Z) )
    return false;
  double x = ON_DotProduct( ON_CrossProduct( X, Y ), Z );
  if ( x <=  ON_SQRT_EPSILON )
    return false;
  return true;
}